

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

int Abc_NtkResubstitute(Abc_Ntk_t *pNtk,int nCutMax,int nStepsMax,int nLevelsOdc,int fUpdateLevel,
                       int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Abc_ManCut_t *p;
  Abc_ManRes_t *p_00;
  Abc_Obj_t *pAVar4;
  ProgressBar *p_01;
  Vec_Ptr_t *vLeaves_00;
  abctime aVar5;
  Dec_Graph_t *pGraph;
  abctime aVar6;
  int local_7c;
  int nNodes;
  int i;
  abctime clkStart;
  abctime clk;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vLeaves;
  Dec_Graph_t *pFForm;
  Odc_Man_t *pManOdc;
  Abc_ManCut_t *pManCut;
  Abc_ManRes_t *pManRes;
  ProgressBar *pProgress;
  int fVerbose_local;
  int fUpdateLevel_local;
  int nLevelsOdc_local;
  int nStepsMax_local;
  int nCutMax_local;
  Abc_Ntk_t *pNtk_local;
  
  pFForm = (Dec_Graph_t *)0x0;
  aVar3 = Abc_Clock();
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                  ,0x96,"int Abc_NtkResubstitute(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  p = Abc_NtkManCutStart(nCutMax,100000,100000,100000);
  p_00 = Abc_ManResubStart(nCutMax,0x96);
  if (0 < nLevelsOdc) {
    pFForm = (Dec_Graph_t *)Abc_NtkDontCareAlloc(nCutMax,nLevelsOdc,fVerbose,fVeryVerbose);
  }
  if (fUpdateLevel != 0) {
    Abc_NtkStartReverseLevels(pNtk,0);
  }
  iVar1 = Abc_NtkLatchNum(pNtk);
  if (iVar1 != 0) {
    for (local_7c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_7c < iVar1; local_7c = local_7c + 1)
    {
      pAVar4 = Abc_NtkBox(pNtk,local_7c);
      iVar1 = Abc_ObjIsLatch(pAVar4);
      if (iVar1 != 0) {
        pAVar4->pNext = (Abc_Obj_t *)pAVar4->field_5;
      }
    }
  }
  iVar1 = Abc_NtkNodeNum(pNtk);
  p_00->nNodesBeg = iVar1;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  p_01 = Extra_ProgressBarStart(_stdout,iVar1);
  for (local_7c = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_7c < iVar2; local_7c = local_7c + 1) {
    pAVar4 = Abc_NtkObj(pNtk,local_7c);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar4), iVar2 != 0)) {
      Extra_ProgressBarUpdate(p_01,local_7c,(char *)0x0);
      iVar2 = Abc_NodeIsPersistant(pAVar4);
      if ((iVar2 == 0) && (iVar2 = Abc_ObjFanoutNum(pAVar4), iVar2 < 0x3e9)) {
        if (iVar1 <= local_7c) break;
        aVar6 = Abc_Clock();
        vLeaves_00 = Abc_NodeFindCut(p,pAVar4,0);
        aVar5 = Abc_Clock();
        p_00->timeCut = (aVar5 - aVar6) + p_00->timeCut;
        if (pFForm != (Dec_Graph_t *)0x0) {
          aVar6 = Abc_Clock();
          Abc_NtkDontCareClear((Odc_Man_t *)pFForm);
          Abc_NtkDontCareCompute((Odc_Man_t *)pFForm,pAVar4,vLeaves_00,p_00->pCareSet);
          aVar5 = Abc_Clock();
          p_00->timeTruth = (aVar5 - aVar6) + p_00->timeTruth;
        }
        aVar6 = Abc_Clock();
        pGraph = Abc_ManResubEval(p_00,pAVar4,vLeaves_00,nStepsMax,fUpdateLevel,fVerbose);
        aVar5 = Abc_Clock();
        p_00->timeRes = (aVar5 - aVar6) + p_00->timeRes;
        if (pGraph != (Dec_Graph_t *)0x0) {
          p_00->nTotalGain = p_00->nLastGain + p_00->nTotalGain;
          aVar6 = Abc_Clock();
          Dec_GraphUpdateNetwork(pAVar4,pGraph,fUpdateLevel,p_00->nLastGain);
          aVar5 = Abc_Clock();
          p_00->timeNtk = (aVar5 - aVar6) + p_00->timeNtk;
          Dec_GraphFree(pGraph);
        }
      }
    }
  }
  Extra_ProgressBarStop(p_01);
  aVar6 = Abc_Clock();
  p_00->timeTotal = aVar6 - aVar3;
  iVar1 = Abc_NtkNodeNum(pNtk);
  p_00->nNodesEnd = iVar1;
  if (fVerbose != 0) {
    Abc_ManResubPrint(p_00);
  }
  Abc_ManResubStop(p_00);
  Abc_NtkManCutStop(p);
  if (pFForm != (Dec_Graph_t *)0x0) {
    Abc_NtkDontCareFree((Odc_Man_t *)pFForm);
  }
  for (local_7c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_7c < iVar1; local_7c = local_7c + 1) {
    pAVar4 = Abc_NtkObj(pNtk,local_7c);
    if (pAVar4 != (Abc_Obj_t *)0x0) {
      (pAVar4->field_5).pData = (void *)0x0;
    }
  }
  iVar1 = Abc_NtkLatchNum(pNtk);
  if (iVar1 != 0) {
    for (local_7c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_7c < iVar1; local_7c = local_7c + 1)
    {
      pAVar4 = Abc_NtkBox(pNtk,local_7c);
      iVar1 = Abc_ObjIsLatch(pAVar4);
      if (iVar1 != 0) {
        pAVar4->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)pAVar4->pNext;
        pAVar4->pNext = (Abc_Obj_t *)0x0;
      }
    }
  }
  Abc_NtkReassignIds(pNtk);
  if (fUpdateLevel == 0) {
    Abc_NtkLevel(pNtk);
  }
  else {
    Abc_NtkStopReverseLevels(pNtk);
  }
  iVar1 = Abc_NtkCheck(pNtk);
  if (iVar1 != 0) {
    aVar6 = Abc_Clock();
    s_ResubTime = aVar6 - aVar3;
  }
  else {
    printf("Abc_NtkRefactor: The network check has failed.\n");
  }
  pNtk_local._4_4_ = (uint)(iVar1 != 0);
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkResubstitute( Abc_Ntk_t * pNtk, int nCutMax, int nStepsMax, int nLevelsOdc, int fUpdateLevel, int fVerbose, int fVeryVerbose )
{
    extern void           Dec_GraphUpdateNetwork( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain );
    ProgressBar * pProgress;
    Abc_ManRes_t * pManRes;
    Abc_ManCut_t * pManCut;
    Odc_Man_t * pManOdc = NULL;
    Dec_Graph_t * pFForm;
    Vec_Ptr_t * vLeaves;
    Abc_Obj_t * pNode;
    abctime clk, clkStart = Abc_Clock();
    int i, nNodes;

    assert( Abc_NtkIsStrash(pNtk) );

    // cleanup the AIG
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
    // start the managers
    pManCut = Abc_NtkManCutStart( nCutMax, 100000, 100000, 100000 );
    pManRes = Abc_ManResubStart( nCutMax, ABC_RS_DIV1_MAX );
    if ( nLevelsOdc > 0 )
    pManOdc = Abc_NtkDontCareAlloc( nCutMax, nLevelsOdc, fVerbose, fVeryVerbose );

    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Abc_NtkStartReverseLevels( pNtk, 0 );

    if ( Abc_NtkLatchNum(pNtk) ) {
        Abc_NtkForEachLatch(pNtk, pNode, i)
            pNode->pNext = (Abc_Obj_t *)pNode->pData;
    }

    // resynthesize each node once
    pManRes->nNodesBeg = Abc_NtkNodeNum(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // skip the constant node
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;

        // compute a reconvergence-driven cut
clk = Abc_Clock();
        vLeaves = Abc_NodeFindCut( pManCut, pNode, 0 );
//        vLeaves = Abc_CutFactorLarge( pNode, nCutMax );
pManRes->timeCut += Abc_Clock() - clk;
/*
        if ( fVerbose && vLeaves )
        printf( "Node %6d : Leaves = %3d. Volume = %3d.\n", pNode->Id, Vec_PtrSize(vLeaves), Abc_CutVolumeCheck(pNode, vLeaves) );
        if ( vLeaves == NULL )
            continue;
*/
        // get the don't-cares
        if ( pManOdc )
        {
clk = Abc_Clock();
            Abc_NtkDontCareClear( pManOdc );
            Abc_NtkDontCareCompute( pManOdc, pNode, vLeaves, pManRes->pCareSet );
pManRes->timeTruth += Abc_Clock() - clk;
        }

        // evaluate this cut
clk = Abc_Clock();
        pFForm = Abc_ManResubEval( pManRes, pNode, vLeaves, nStepsMax, fUpdateLevel, fVerbose );
//        Vec_PtrFree( vLeaves );
//        Abc_ManResubCleanup( pManRes );
pManRes->timeRes += Abc_Clock() - clk;
        if ( pFForm == NULL )
            continue;
        pManRes->nTotalGain += pManRes->nLastGain;
/*
        if ( pManRes->nLeaves == 4 && pManRes->nMffc == 2 && pManRes->nLastGain == 1 )
        {
            printf( "%6d :  L = %2d. V = %2d. Mffc = %2d. Divs = %3d.   Up = %3d. Un = %3d. B = %3d.\n", 
                   pNode->Id, pManRes->nLeaves, Abc_CutVolumeCheck(pNode, vLeaves), pManRes->nMffc, pManRes->nDivs, 
                   pManRes->vDivs1UP->nSize, pManRes->vDivs1UN->nSize, pManRes->vDivs1B->nSize );
            Abc_ManResubPrintDivs( pManRes, pNode, vLeaves );
        }
*/
        // acceptable replacement found, update the graph
clk = Abc_Clock();
        Dec_GraphUpdateNetwork( pNode, pFForm, fUpdateLevel, pManRes->nLastGain );
pManRes->timeNtk += Abc_Clock() - clk;
        Dec_GraphFree( pFForm );
    }
    Extra_ProgressBarStop( pProgress );
pManRes->timeTotal = Abc_Clock() - clkStart;
    pManRes->nNodesEnd = Abc_NtkNodeNum(pNtk);

    // print statistics
    if ( fVerbose )
    Abc_ManResubPrint( pManRes );

    // delete the managers
    Abc_ManResubStop( pManRes );
    Abc_NtkManCutStop( pManCut );
    if ( pManOdc ) Abc_NtkDontCareFree( pManOdc );

    // clean the data field
    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->pData = NULL;

    if ( Abc_NtkLatchNum(pNtk) ) {
        Abc_NtkForEachLatch(pNtk, pNode, i)
            pNode->pData = pNode->pNext, pNode->pNext = NULL;
    }

    // put the nodes into the DFS order and reassign their IDs
    Abc_NtkReassignIds( pNtk );
//    Abc_AigCheckFaninOrder( pNtk->pManFunc );
    // fix the levels
    if ( fUpdateLevel )
        Abc_NtkStopReverseLevels( pNtk );
    else
        Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRefactor: The network check has failed.\n" );
        return 0;
    }
s_ResubTime = Abc_Clock() - clkStart;
    return 1;
}